

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O1

aiNode * __thiscall Assimp::D3MF::XmlSerializer::ReadObject(XmlSerializer *this,aiScene *scene)

{
  pointer *pppaVar1;
  iterator __position;
  pointer puVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  aiNode *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiMesh *paVar7;
  uint *puVar8;
  long lVar9;
  pointer __p;
  unsigned_long uVar10;
  long lVar11;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> node;
  vector<unsigned_long,_std::allocator<unsigned_long>_> meshIds;
  aiMesh *mesh;
  string name;
  string type;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  aiMesh *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 local_70 [16];
  vector<aiMesh*,std::allocator<aiMesh*>> *local_60;
  unsigned_long local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  char *pcVar6;
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_80 = local_70;
  local_78 = (char *)0x0;
  local_70[0] = 0;
  local_50 = local_40;
  local_48 = (char *)0x0;
  local_40[0] = 0;
  iVar5 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  pcVar3 = local_78;
  pcVar6 = (char *)CONCAT44(extraout_var,iVar5);
  if (pcVar6 != (char *)0x0) {
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_80,0,pcVar3,(ulong)pcVar6);
  }
  iVar5 = (*this->xmlReader->_vptr_IIrrXMLReader[7])();
  pcVar3 = local_48;
  pcVar6 = (char *)CONCAT44(extraout_var_00,iVar5);
  if (pcVar6 != (char *)0x0) {
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar3,(ulong)pcVar6);
  }
  pcVar3 = local_78;
  this_00->mParent = scene->mRootNode;
  if (local_78 < &DAT_00000400) {
    (this_00->mName).length = (ai_uint32)local_78;
    memcpy((this_00->mName).data,local_80,(size_t)local_78);
    (this_00->mName).data[(long)pcVar3] = '\0';
  }
  local_60 = (vector<aiMesh*,std::allocator<aiMesh*>> *)&this->mMeshes;
  uVar10 = (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  while (bVar4 = ReadToEndElement(this,(string *)&XmlTag::object_abi_cxx11_),
        puVar2 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start, bVar4) {
    (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    iVar5 = std::__cxx11::string::compare(XmlTag::mesh_abi_cxx11_);
    if (iVar5 == 0) {
      paVar7 = ReadMesh(this);
      pcVar3 = local_78;
      local_88 = paVar7;
      if (local_78 < &DAT_00000400) {
        (paVar7->mName).length = (ai_uint32)local_78;
        memcpy((paVar7->mName).data,local_80,(size_t)local_78);
        (paVar7->mName).data[(long)pcVar3] = '\0';
      }
      __position._M_current =
           (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                  (local_60,__position,&local_88);
      }
      else {
        *__position._M_current = local_88;
        pppaVar1 = &(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppaVar1 = *pppaVar1 + 1;
      }
      local_58 = uVar10;
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_58);
      }
      else {
        *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar10;
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar10 = uVar10 + 1;
    }
  }
  lVar11 = (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  this_00->mNumMeshes = (uint)lVar11;
  puVar8 = (uint *)operator_new__((ulong)((long)local_a8.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_a8.
                                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 1 &
                                  0x3fffffffc);
  this_00->mMeshes = puVar8;
  if (0 < lVar11) {
    lVar11 = lVar11 + 1;
    lVar9 = 0;
    do {
      *(undefined4 *)((long)puVar8 + lVar9) = *(undefined4 *)((long)puVar2 + lVar9 * 2);
      lVar11 = lVar11 + -1;
      lVar9 = lVar9 + 4;
    } while (1 < lVar11);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return this_00;
}

Assistant:

aiNode* ReadObject(aiScene* scene) {
        std::unique_ptr<aiNode> node(new aiNode());

        std::vector<unsigned long> meshIds;

        const char *attrib( nullptr );
        std::string name, type;
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::id.c_str() );
        if ( nullptr != attrib ) {
            name = attrib;
        }
        attrib = xmlReader->getAttributeValue( D3MF::XmlTag::type.c_str() );
        if ( nullptr != attrib ) {
            type = attrib;
        }

        node->mParent = scene->mRootNode;
        node->mName.Set(name);

        size_t meshIdx = mMeshes.size();

        while(ReadToEndElement(D3MF::XmlTag::object)) {
            if(xmlReader->getNodeName() == D3MF::XmlTag::mesh) {
                auto mesh = ReadMesh();

                mesh->mName.Set(name);
                mMeshes.push_back(mesh);
                meshIds.push_back(static_cast<unsigned long>(meshIdx));
                ++meshIdx;
            }
        }

        node->mNumMeshes = static_cast<unsigned int>(meshIds.size());

        node->mMeshes = new unsigned int[node->mNumMeshes];

        std::copy(meshIds.begin(), meshIds.end(), node->mMeshes);

        return node.release();
    }